

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O0

void printrowsz(int vulnerability_id,FILE *finx,longlong size,longlong uncompressedSize)

{
  uint uVar1;
  reference pvVar2;
  reference pvVar3;
  uint *local_88;
  VulnerabilityRow *row;
  size_type sStack_78;
  int ret;
  uLongf destLen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressedBuffer;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressedBuffer;
  uLongf i;
  longlong uncompressedSize_local;
  longlong size_local;
  FILE *finx_local;
  int vulnerability_id_local;
  
  compressedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,size + 1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&destLen);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&destLen,uncompressedSize);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
  fread(pvVar2,size,1,(FILE *)finx);
  sStack_78 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&destLen);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&destLen,0);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
  uVar1 = uncompress(pvVar2,&stack0xffffffffffffff88,pvVar3,size);
  if (uVar1 != 0) {
    fprintf(_stderr,"FATAL: Got bad return code from uncompress %d\n",(ulong)uVar1);
    exit(1);
  }
  local_88 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&destLen,0)
  ;
  for (; compressedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage < (ulong)uncompressedSize;
      compressedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           compressedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 0xc) {
    printf("%d, %d, %d, %.10e\n",(double)(float)local_88[2],(ulong)(uint)vulnerability_id,
           (ulong)*local_88,(ulong)local_88[1]);
    local_88 = local_88 + 3;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&destLen);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return;
}

Assistant:

inline void printrowsz(int vulnerability_id, FILE *finx, long long size,
		       long long uncompressedSize) {

	uLongf i = 0;
	std::vector<unsigned char> compressedBuffer;
	compressedBuffer.resize(size + 1);

	std::vector<unsigned char> uncompressedBuffer;
	uncompressedBuffer.resize(uncompressedSize);

	fread(&compressedBuffer[0], size, 1, finx);
	uLongf destLen = (uLongf)uncompressedBuffer.size();
	int ret = uncompress(&uncompressedBuffer[0], &destLen,
			     &compressedBuffer[0], size);
	if (ret != Z_OK) {
		fprintf(stderr, "FATAL: Got bad return code from uncompress %d\n", ret);
		exit(EXIT_FAILURE);
	}

	VulnerabilityRow *row = (VulnerabilityRow*)&uncompressedBuffer[0];
	while (i < uncompressedSize) {
		printf("%d, %d, %d, %.10e\n", vulnerability_id,
		       row->intensity_bin_id, row->damage_bin_id,
		       row->probability);
		row++;
		i += sizeof(VulnerabilityRow);
	}

}